

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O0

void Abc_NodeCheckDist1Free(Abc_Obj_t *pNode)

{
  char *pcVar1;
  int iVar2;
  int local_34;
  int Counter;
  int nVars;
  int i;
  char *pCube2;
  char *pCube;
  char *pSop;
  Abc_Obj_t *pNode_local;
  
  pcVar1 = (char *)(pNode->field_5).pData;
  iVar2 = Abc_ObjFaninNum(pNode);
  pCube2 = pcVar1;
  do {
    _nVars = pcVar1;
    if (*pCube2 == '\0') {
      return;
    }
    for (; *_nVars != '\0'; _nVars = _nVars + (iVar2 + 3)) {
      local_34 = 0;
      if (pCube2 != _nVars) {
        for (Counter = 0; Counter < iVar2; Counter = Counter + 1) {
          if (pCube2[Counter] != _nVars[Counter]) {
            local_34 = local_34 + 1;
          }
        }
        if (local_34 < 2) {
          __assert_fail("Counter > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                        ,0x26c,"void Abc_NodeCheckDist1Free(Abc_Obj_t *)");
        }
      }
    }
    pCube2 = pCube2 + (iVar2 + 3);
  } while( true );
}

Assistant:

void Abc_NodeCheckDist1Free( Abc_Obj_t * pNode )
{
    char * pSop = (char *)pNode->pData;
    char * pCube, * pCube2;
    int i, nVars = Abc_ObjFaninNum(pNode);
    Abc_SopForEachCube( pSop, nVars, pCube )
    Abc_SopForEachCube( pSop, nVars, pCube2 )
    {
        int Counter = 0;
        if ( pCube == pCube2 )
            continue;
        for ( i = 0; i < nVars; i++ )
            if ( pCube[i] != pCube2[i] )
                Counter++;
        assert( Counter > 1 );
    }
}